

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O1

int Gia_RsbFindFaninAdd(int iFan,int *pFanins,int *pFaninCounts,int nFanins)

{
  ulong uVar1;
  
  if (nFanins < 1) {
    uVar1 = 0;
  }
  else {
    uVar1 = 0;
    do {
      if (pFanins[uVar1] == iFan) goto LAB_007a717d;
      uVar1 = uVar1 + 1;
    } while ((uint)nFanins != uVar1);
    uVar1 = (ulong)(uint)nFanins;
  }
LAB_007a717d:
  pFanins[uVar1 & 0xffffffff] = iFan;
  pFaninCounts[uVar1 & 0xffffffff] = pFaninCounts[uVar1 & 0xffffffff] + 1;
  return (uint)((int)uVar1 == nFanins) + nFanins;
}

Assistant:

int Gia_RsbFindFaninAdd( int iFan, int pFanins[32], int pFaninCounts[32], int nFanins )
{
    int i;
    for ( i = 0; i < nFanins; i++ )
        if ( pFanins[i] == iFan )
            break;
    pFanins[i] = iFan;
    pFaninCounts[i]++;
    return nFanins + (i == nFanins);
}